

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

container_t * shared_container_extract_copy(shared_container_t *sc,uint8_t *typecode)

{
  _Bool _Var1;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  container_t *answer;
  container_t *local_18;
  
  *in_RSI = *(undefined1 *)(in_RDI + 1);
  _Var1 = croaring_refcount_dec((croaring_refcount_t *)((long)in_RDI + 0xc));
  if (_Var1) {
    local_18 = (container_t *)*in_RDI;
    *in_RDI = 0;
    roaring_free((void *)0x15f993);
  }
  else {
    local_18 = container_clone(in_RDI,(uint8_t)((ulong)in_RSI >> 0x38));
  }
  return local_18;
}

Assistant:

container_t *shared_container_extract_copy(shared_container_t *sc,
                                           uint8_t *typecode) {
    assert(sc->typecode != SHARED_CONTAINER_TYPE);
    *typecode = sc->typecode;
    container_t *answer;
    if (croaring_refcount_dec(&sc->counter)) {
        answer = sc->container;
        sc->container = NULL;  // paranoid
        roaring_free(sc);
    } else {
        answer = container_clone(sc->container, *typecode);
    }
    assert(*typecode != SHARED_CONTAINER_TYPE);
    return answer;
}